

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamReader_p.cpp
# Opt level: O1

bool __thiscall BamTools::Internal::BamReaderPrivate::Close(BamReaderPrivate *this)

{
  bool bVar1;
  string message;
  string streamError;
  
  std::vector<BamTools::RefData,_std::allocator<BamTools::RefData>_>::clear(&this->m_references);
  BamHeader::Clear(&this->m_header);
  (this->m_filename)._M_string_length = 0;
  *(this->m_filename)._M_dataplus._M_p = '\0';
  BamRandomAccessController::Close(&this->m_randomAccessController);
  bVar1 = BgzfStream::IsOpen(&this->m_stream);
  if (bVar1) {
    BgzfStream::Close(&this->m_stream);
  }
  return true;
}

Assistant:

bool BamReaderPrivate::Close(void) {

    // clear BAM metadata
    m_references.clear();
    m_header.Clear();

    // clear filename
    m_filename.clear();

    // close random access controller
    m_randomAccessController.Close();

    // if stream is open, attempt close
    if ( IsOpen() ) {
        try {
            m_stream.Close();
        } catch ( BamException& e ) {
            const string streamError = e.what();
            const string message = string("encountered error closing BAM file: \n\t") + streamError;
            SetErrorString("BamReader::Close", message);
            return false;
        }
    }

    // return success
    return true;
}